

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void kurtosis_double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  close_to<double> predicate_28;
  close_to<double> predicate_29;
  close_to<double> predicate_30;
  close_to<double> predicate_31;
  close_to<double> predicate_32;
  close_to<double> predicate_33;
  close_to<double> predicate_34;
  close_to<double> predicate_35;
  close_to<double> predicate_36;
  close_to<double> predicate_37;
  close_to<double> predicate_38;
  close_to<double> predicate_39;
  close_to<double> predicate_40;
  close_to<double> predicate_41;
  close_to<double> predicate_42;
  close_to<double> predicate_43;
  double absolute_tolerance;
  double *in_stack_fffffffffffff9a8;
  double local_648;
  value_type local_640;
  value_type local_638;
  double local_628;
  value_type local_620;
  value_type local_618;
  double local_608;
  value_type local_600;
  value_type local_5f8;
  double local_5e8;
  value_type local_5e0;
  value_type local_5d8;
  double local_5c8;
  value_type local_5c0;
  value_type local_5b8;
  double local_5a8;
  value_type local_5a0;
  value_type local_598;
  double local_588;
  value_type local_580;
  value_type local_578;
  double local_568;
  value_type local_560;
  value_type local_558;
  double local_548;
  value_type local_540;
  value_type local_538;
  double local_528;
  value_type local_520;
  value_type local_518;
  double local_508;
  value_type local_500;
  value_type local_4f8;
  double local_4e8;
  value_type local_4e0;
  value_type local_4d8;
  double local_4c8;
  value_type local_4c0;
  value_type local_4b8;
  double local_4a8;
  value_type local_4a0;
  value_type local_498;
  double local_488;
  value_type local_480;
  value_type local_478;
  double local_468;
  value_type local_460;
  value_type local_458;
  double local_448;
  value_type local_440;
  value_type local_438;
  double local_428;
  value_type local_420;
  value_type local_418;
  double local_408;
  value_type local_400;
  value_type local_3f8;
  double local_3e8;
  value_type local_3e0;
  value_type local_3d8;
  double local_3c8;
  value_type local_3c0;
  value_type local_3b8;
  double local_3a8;
  value_type local_3a0;
  value_type local_398;
  double local_388;
  value_type local_380;
  value_type local_378;
  double local_368;
  value_type local_360;
  value_type local_358;
  double local_348;
  value_type local_340;
  value_type local_338;
  double local_328;
  value_type local_320;
  value_type local_318;
  double local_308;
  value_type local_300;
  value_type local_2f8;
  double local_2e8;
  value_type local_2e0;
  value_type local_2d8;
  double local_2c8;
  value_type local_2c0;
  value_type local_2b8;
  double local_2a8;
  value_type local_2a0;
  value_type local_298;
  double local_288;
  value_type local_280;
  value_type local_278;
  double local_268;
  value_type local_260;
  value_type local_258;
  double local_248;
  value_type local_240;
  value_type local_238;
  double local_228;
  value_type local_220;
  value_type local_218;
  double local_208;
  value_type local_200;
  value_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  value_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  value_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  value_type local_198;
  double local_188;
  value_type local_180;
  value_type local_178;
  double local_168;
  value_type local_160;
  value_type local_158;
  double local_148;
  value_type local_140;
  value_type local_138;
  double local_128;
  value_type local_120;
  value_type local_118;
  double local_108;
  value_type local_100;
  value_type local_f8;
  double local_e8;
  value_type local_e0;
  value_type local_d8;
  double local_c8;
  value_type local_c0 [4];
  undefined8 local_a0;
  value_type local_98 [2];
  undefined8 local_88;
  value_type local_80 [2];
  undefined8 local_70;
  value_type local_68 [2];
  undefined8 local_58;
  value_type local_50 [2];
  undefined1 local_40 [8];
  moment_kurtosis<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::basic_moment
            ((basic_moment<double,_(trial::online::with)4> *)local_40);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,1.0);
  local_50[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_58 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x240,"void kurtosis_double_suite::test_exponential_increase()",local_50,&local_58);
  local_68[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x241,"void kurtosis_double_suite::test_exponential_increase()",local_68,&local_70);
  local_80[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_88 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x242,"void kurtosis_double_suite::test_exponential_increase()",local_80,&local_88);
  local_98[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                          ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_a0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x243,"void kurtosis_double_suite::test_exponential_increase()",local_98,&local_a0);
  local_c0[2] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
                unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_c0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x244,"void kurtosis_double_suite::test_exponential_increase()",local_c0 + 2,
             local_c0 + 1);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,10.0);
  local_c0[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_c8 = 5.5;
  local_d8 = filter.sum.kurtosis;
  predicate_43.absolute = tolerance.relative;
  predicate_43.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x246,0x113bf2,(char *)local_c0,&local_c8,in_stack_fffffffffffff9a8,
             predicate_43);
  local_e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_e8 = 20.25;
  local_f8 = filter.sum.kurtosis;
  predicate_42.absolute = tolerance.relative;
  predicate_42.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","20.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x247,0x113bf2,(char *)&local_e0,&local_e8,in_stack_fffffffffffff9a8,
             predicate_42);
  local_100 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_108 = 0.0;
  local_118 = filter.sum.kurtosis;
  predicate_41.absolute = tolerance.relative;
  predicate_41.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x248,0x113bf2,(char *)&local_100,&local_108,in_stack_fffffffffffff9a8,
             predicate_41);
  local_120 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_128 = 1.0;
  local_138 = filter.sum.kurtosis;
  predicate_40.absolute = tolerance.relative;
  predicate_40.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x249,0x113bf2,(char *)&local_120,&local_128,in_stack_fffffffffffff9a8,
             predicate_40);
  local_140 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_148 = 0.0;
  local_158 = filter.sum.kurtosis;
  predicate_39.absolute = tolerance.relative;
  predicate_39.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x24a,0x113bf2,(char *)&local_140,&local_148,in_stack_fffffffffffff9a8,
             predicate_39);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,100.0);
  local_160 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_168 = 37.0;
  local_178 = filter.sum.kurtosis;
  predicate_38.absolute = tolerance.relative;
  predicate_38.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","37.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x24c,0x113bf2,(char *)&local_160,&local_168,in_stack_fffffffffffff9a8,
             predicate_38);
  local_180 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_188 = 1998.0;
  local_198 = filter.sum.kurtosis;
  predicate_37.absolute = tolerance.relative;
  predicate_37.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1998.","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x24d,0x113bf2,(char *)&local_180,&local_188,in_stack_fffffffffffff9a8,
             predicate_37);
  local_1a0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_1a8 = 0.68567;
  local_1b8 = filter.sum.kurtosis;
  predicate_36.absolute = tolerance.relative;
  predicate_36.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.68567","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x24e,0x113bf2,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffff9a8,
             predicate_36);
  local_1c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_1c8 = 1.5;
  local_1d8 = filter.sum.kurtosis;
  predicate_35.absolute = tolerance.relative;
  predicate_35.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x24f,0x113bf2,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffff9a8,
             predicate_35);
  local_1e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_1e8 = 0.0;
  local_1f8 = filter.sum.kurtosis;
  predicate_34.absolute = tolerance.relative;
  predicate_34.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x250,0x113bf2,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffff9a8,
             predicate_34);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,1000.0);
  local_200 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_208 = 277.75;
  local_218 = filter.sum.kurtosis;
  predicate_33.absolute = tolerance.relative;
  predicate_33.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","277.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x252,0x113bf2,(char *)&local_200,&local_208,in_stack_fffffffffffff9a8,
             predicate_33);
  local_220 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_228 = 175380.0;
  local_238 = filter.sum.kurtosis;
  predicate_32.absolute = tolerance.relative;
  predicate_32.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","175380.","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x253,0x113bf2,(char *)&local_220,&local_228,in_stack_fffffffffffff9a8,
             predicate_32);
  local_240 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_248 = 1.12582;
  local_258 = filter.sum.kurtosis;
  predicate_31.absolute = tolerance.relative;
  predicate_31.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.12582","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x254,0x113bf2,(char *)&local_240,&local_248,in_stack_fffffffffffff9a8,
             predicate_31);
  local_260 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_268 = 2.30928;
  local_278 = filter.sum.kurtosis;
  predicate_30.absolute = tolerance.relative;
  predicate_30.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","2.30928","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x255,0x113bf2,(char *)&local_260,&local_268,in_stack_fffffffffffff9a8,
             predicate_30);
  local_280 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_288 = 6.81961;
  local_298 = filter.sum.kurtosis;
  predicate_29.absolute = tolerance.relative;
  predicate_29.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","6.81961","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x256,0x113bf2,(char *)&local_280,&local_288,in_stack_fffffffffffff9a8,
             predicate_29);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,10000.0);
  local_2a0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_2a8 = 2222.2;
  local_2b8 = filter.sum.kurtosis;
  predicate_28.absolute = tolerance.relative;
  predicate_28.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2222.2","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x258,0x113bf2,(char *)&local_2a0,&local_2a8,in_stack_fffffffffffff9a8,
             predicate_28);
  local_2c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_2c8 = 15263800.0;
  local_2d8 = filter.sum.kurtosis;
  predicate_27.absolute = tolerance.relative;
  predicate_27.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.52638e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x259,0x113bf2,(char *)&local_2c0,&local_2c8,in_stack_fffffffffffff9a8,
             predicate_27);
  local_2e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_2e8 = 1.46675;
  local_2f8 = filter.sum.kurtosis;
  predicate_26.absolute = tolerance.relative;
  predicate_26.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.46675","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x25a,0x113bf2,(char *)&local_2e0,&local_2e8,in_stack_fffffffffffff9a8,
             predicate_26);
  local_300 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_308 = 3.20222;
  local_318 = filter.sum.kurtosis;
  predicate_25.absolute = tolerance.relative;
  predicate_25.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","3.20222","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x25b,0x113bf2,(char *)&local_300,&local_308,in_stack_fffffffffffff9a8,
             predicate_25);
  local_320 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_328 = 7.8089;
  local_338 = filter.sum.kurtosis;
  predicate_24.absolute = tolerance.relative;
  predicate_24.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","7.8089","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x25c,0x113bf2,(char *)&local_320,&local_328,in_stack_fffffffffffff9a8,
             predicate_24);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,100000.0);
  local_340 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_348 = 18518.5;
  local_358 = filter.sum.kurtosis;
  predicate_23.absolute = tolerance.relative;
  predicate_23.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","18518.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x25e,0x113bf2,(char *)&local_340,&local_348,in_stack_fffffffffffff9a8,
             predicate_23);
  local_360 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_368 = 1340570000.0;
  local_378 = filter.sum.kurtosis;
  predicate_22.absolute = tolerance.relative;
  predicate_22.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.34057e9","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x25f,0x113bf2,(char *)&local_360,&local_368,in_stack_fffffffffffff9a8,
             predicate_22);
  local_380 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_388 = 1.75227;
  local_398 = filter.sum.kurtosis;
  predicate_21.absolute = tolerance.relative;
  predicate_21.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.75227","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x260,0x113bf2,(char *)&local_380,&local_388,in_stack_fffffffffffff9a8,
             predicate_21);
  local_3a0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_3a8 = 4.12966;
  local_3b8 = filter.sum.kurtosis;
  predicate_20.absolute = tolerance.relative;
  predicate_20.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","4.12966","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x261,0x113bf2,(char *)&local_3a0,&local_3a8,in_stack_fffffffffffff9a8,
             predicate_20);
  local_3c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_3c8 = 8.79483;
  local_3d8 = filter.sum.kurtosis;
  predicate_19.absolute = tolerance.relative;
  predicate_19.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","8.79483","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x262,0x113bf2,(char *)&local_3c0,&local_3c8,in_stack_fffffffffffff9a8,
             predicate_19);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,1000000.0);
  local_3e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_3e8 = 158730.0;
  local_3f8 = filter.sum.kurtosis;
  predicate_18.absolute = tolerance.relative;
  predicate_18.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.5873e5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x264,0x113bf2,(char *)&local_3e0,&local_3e8,in_stack_fffffffffffff9a8,
             predicate_18);
  local_400 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_408 = 119105000000.0;
  local_418 = filter.sum.kurtosis;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.19105e11","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x265,0x113bf2,(char *)&local_400,&local_408,in_stack_fffffffffffff9a8,
             predicate_17);
  local_420 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_428 = 2.00181;
  local_438 = filter.sum.kurtosis;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","2.00181","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x266,0x113bf2,(char *)&local_420,&local_428,in_stack_fffffffffffff9a8,
             predicate_16);
  local_440 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_448 = 5.07455;
  local_458 = filter.sum.kurtosis;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","5.07455","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x267,0x113bf2,(char *)&local_440,&local_448,in_stack_fffffffffffff9a8,
             predicate_15);
  local_460 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_468 = 9.77891;
  local_478 = filter.sum.kurtosis;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","9.77891","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x268,0x113bf2,(char *)&local_460,&local_468,in_stack_fffffffffffff9a8,
             predicate_14);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,10000000.0);
  local_480 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_488 = 1388900.0;
  local_498 = filter.sum.kurtosis;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.3889e6","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x26a,0x113bf2,(char *)&local_480,&local_488,in_stack_fffffffffffff9a8,
             predicate_13);
  local_4a0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_4a8 = 10697300000000.0;
  local_4b8 = filter.sum.kurtosis;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.06973e13","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x26b,0x113bf2,(char *)&local_4a0,&local_4a8,in_stack_fffffffffffff9a8,
             predicate_12);
  local_4c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_4c8 = 2.22579;
  local_4d8 = filter.sum.kurtosis;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","2.22579","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x26c,0x113bf2,(char *)&local_4c0,&local_4c8,in_stack_fffffffffffff9a8,
             predicate_11);
  local_4e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_4e8 = 6.02947;
  local_4f8 = filter.sum.kurtosis;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","6.02947","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x26d,0x113bf2,(char *)&local_4e0,&local_4e8,in_stack_fffffffffffff9a8,
             predicate_10);
  local_500 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_508 = 10.7619;
  local_518 = filter.sum.kurtosis;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","10.7619","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x26e,0x113bf2,(char *)&local_500,&local_508,in_stack_fffffffffffff9a8,
             predicate_09);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,100000000.0);
  local_520 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_528 = 12345679.0;
  local_538 = filter.sum.kurtosis;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","12345679.","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x270,0x113bf2,(char *)&local_520,&local_528,in_stack_fffffffffffff9a8,
             predicate_08);
  local_540 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_548 = 969919000000000.0;
  local_558 = filter.sum.kurtosis;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","9.69919e14","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x271,0x113bf2,(char *)&local_540,&local_548,in_stack_fffffffffffff9a8,
             predicate_07);
  local_560 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_568 = 2.43051;
  local_578 = filter.sum.kurtosis;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","2.43051","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x272,0x113bf2,(char *)&local_560,&local_568,in_stack_fffffffffffff9a8,
             predicate_06);
  local_580 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_588 = 6.99069;
  local_598 = filter.sum.kurtosis;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","6.99069","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x273,0x113bf2,(char *)&local_580,&local_588,in_stack_fffffffffffff9a8,
             predicate_05);
  local_5a0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_5a8 = 11.7442;
  local_5b8 = filter.sum.kurtosis;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","11.7442","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x274,0x113bf2,(char *)&local_5a0,&local_5a8,in_stack_fffffffffffff9a8,
             predicate_04);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_40,1000000000.0);
  local_5c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_40);
  local_5c8 = 111110000.0;
  local_5d8 = filter.sum.kurtosis;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.1111e8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x276,0x113bf2,(char *)&local_5c0,&local_5c8,in_stack_fffffffffffff9a8,
             predicate_03);
  local_5e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_40);
  local_5e8 = 8.86644e+16;
  local_5f8 = filter.sum.kurtosis;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","8.86644e16","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x277,0x113bf2,(char *)&local_5e0,&local_5e8,in_stack_fffffffffffff9a8,
             predicate_02);
  local_600 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_40);
  local_608 = 2.62009;
  local_618 = filter.sum.kurtosis;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","2.62009","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x278,0x113bf2,(char *)&local_600,&local_608,in_stack_fffffffffffff9a8,
             predicate_01);
  local_620 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_628 = 7.95612;
  local_638 = filter.sum.kurtosis;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","7.95612","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x279,0x113bf2,(char *)&local_620,&local_628,in_stack_fffffffffffff9a8,
             predicate_00);
  local_640 = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
              unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_40);
  local_648 = 12.726;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.kurtosis;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_kurtosis()","12.726","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x27a,0x113bf2,(char *)&local_640,&local_648,(double *)filter.sum.kurtosis,
             predicate);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::moment_kurtosis<double> filter;
    filter.push(1e0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_kurtosis(), 0.0);
    filter.push(1e1);
    TRIAL_TEST_WITH(filter.mean(), 5.5, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 20.25, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 0.0, tolerance);
    filter.push(1e2);
    TRIAL_TEST_WITH(filter.mean(), 37.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1998., tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.68567, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.5, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 0.0, tolerance);
    filter.push(1e3);
    TRIAL_TEST_WITH(filter.mean(), 277.75, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 175380., tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.12582, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 2.30928, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 6.81961, tolerance);
    filter.push(1e4);
    TRIAL_TEST_WITH(filter.mean(), 2222.2, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.52638e7, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.46675, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 3.20222, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 7.8089, tolerance);
    filter.push(1e5);
    TRIAL_TEST_WITH(filter.mean(), 18518.5, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.34057e9, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.75227, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 4.12966, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 8.79483, tolerance);
    filter.push(1e6);
    TRIAL_TEST_WITH(filter.mean(), 1.5873e5, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.19105e11, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 2.00181, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 5.07455, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 9.77891, tolerance);
    filter.push(1e7);
    TRIAL_TEST_WITH(filter.mean(), 1.3889e6, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.06973e13, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 2.22579, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 6.02947, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 10.7619, tolerance);
    filter.push(1e8);
    TRIAL_TEST_WITH(filter.mean(), 12345679., tolerance);
    TRIAL_TEST_WITH(filter.variance(), 9.69919e14, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 2.43051, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 6.99069, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 11.7442, tolerance);
    filter.push(1e9);
    TRIAL_TEST_WITH(filter.mean(), 1.1111e8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 8.86644e16, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 2.62009, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 7.95612, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_kurtosis(), 12.726, tolerance);
}